

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ulong uVar1;
  mbedtls_mpi_uint *__src;
  long lVar2;
  int iVar3;
  ulong uVar4;
  mbedtls_mpi_uint *__dest;
  ulong uVar5;
  
  iVar3 = -0x10;
  if (nblimbs < 0x2711) {
    uVar1 = X->n;
    if (uVar1 <= nblimbs) {
      iVar3 = mbedtls_mpi_grow(X,nblimbs);
      return iVar3;
    }
    uVar4 = uVar1 + 1;
    do {
      if (uVar4 == 2) {
        uVar5 = 1;
        break;
      }
      uVar5 = uVar4 - 1;
      lVar2 = uVar4 - 2;
      uVar4 = uVar5;
    } while (X->p[lVar2] == 0);
    if (nblimbs < uVar5) {
      nblimbs = uVar5;
    }
    __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
    if (__dest != (mbedtls_mpi_uint *)0x0) {
      __src = X->p;
      if (__src != (mbedtls_mpi_uint *)0x0) {
        memcpy(__dest,__src,nblimbs * 8);
        mbedtls_platform_zeroize(__src,uVar1 << 3);
        free(X->p);
      }
      X->n = nblimbs;
      X->p = __dest;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_shrink( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;
    size_t i;
    MPI_VALIDATE_RET( X != NULL );

    if( nblimbs > MBEDTLS_MPI_MAX_LIMBS )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    /* Actually resize up if there are currently fewer than nblimbs limbs. */
    if( X->n <= nblimbs )
        return( mbedtls_mpi_grow( X, nblimbs ) );
    /* After this point, then X->n > nblimbs and in particular X->n > 0. */

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;
    i++;

    if( i < nblimbs )
        i = nblimbs;

    if( ( p = (mbedtls_mpi_uint*)mbedtls_calloc( i, ciL ) ) == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->p != NULL )
    {
        memcpy( p, X->p, i * ciL );
        mbedtls_mpi_zeroize( X->p, X->n );
        mbedtls_free( X->p );
    }

    X->n = i;
    X->p = p;

    return( 0 );
}